

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t insertion_length,size_t indent_length)

{
  string *__lhs;
  undefined4 uVar1;
  undefined4 uVar2;
  GeneratorContextImpl *pGVar3;
  GeneratedCodeInfo_Annotation *from;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  ostream *poVar7;
  GeneratedCodeInfo_Annotation *this_00;
  void **ppvVar8;
  long lVar9;
  long lVar10;
  _Base_ptr data;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  GeneratedCodeInfo new_metadata;
  GeneratedCodeInfo metadata;
  undefined1 local_c0 [64];
  GeneratedCodeInfo local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pGVar3 = this->directory_;
  __lhs = &this->filename_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,__lhs
                 ,".pb.meta");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(pGVar3->files_)._M_t,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  if (((_Rb_tree_header *)iVar6._M_node ==
       &(this->directory_->files_)._M_t._M_impl.super__Rb_tree_header) &&
     ((this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.current_size_ == 0)) {
    return;
  }
  GeneratedCodeInfo::GeneratedCodeInfo(&local_80);
  pGVar3 = this->directory_;
  if ((_Rb_tree_header *)iVar6._M_node == &(pGVar3->files_)._M_t._M_impl.super__Rb_tree_header) {
    std::operator+(&local_50,__lhs,".pb.meta");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[1],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c0,&local_50,(char (*) [1])0x3cb5b9);
    pVar11 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&pGVar3->files_,
                        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_c0);
    data = pVar11.first._M_node._M_node + 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_c0);
    std::__cxx11::string::~string((string *)&local_50);
LAB_0027ca32:
    bVar4 = false;
  }
  else {
    data = iVar6._M_node + 2;
    bVar4 = MessageLite::ParseFromString((MessageLite *)&local_80,(ConstStringParam)data);
    if (bVar4) goto LAB_0027ca32;
    bVar5 = TextFormat::ParseFromString((ConstStringParam)data,&local_80.super_Message);
    bVar4 = true;
    if (!bVar5) {
      poVar7 = std::operator<<((ostream *)&std::cerr,(string *)__lhs);
      poVar7 = std::operator<<(poVar7,".pb.meta: Could not parse metadata as wire or text format.");
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_0027cb4b;
    }
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_c0);
  ppvVar8 = (local_80.annotation_.super_RepeatedPtrFieldBase.rep_)->elements;
  if (local_80.annotation_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  bVar5 = false;
  lVar10 = 0;
  for (lVar9 = 0; (long)local_80.annotation_.super_RepeatedPtrFieldBase.current_size_ * 8 != lVar9;
      lVar9 = lVar9 + 8) {
    from = *(GeneratedCodeInfo_Annotation **)((long)ppvVar8 + lVar9);
    if ((insertion_offset <= (ulong)(long)from->begin_) && (!bVar5)) {
      InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                        (GeneratedCodeInfo *)local_c0);
      lVar10 = lVar10 + insertion_length;
      bVar5 = true;
    }
    this_00 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Add
                        ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
                         (local_c0 + 0x10));
    GeneratedCodeInfo_Annotation::CopyFrom(this_00,from);
    *(byte *)(this_00->_has_bits_).has_bits_ = (byte)(this_00->_has_bits_).has_bits_[0] | 6;
    uVar1 = this_00->begin_;
    uVar2 = this_00->end_;
    this_00->begin_ = (int)lVar10 + uVar1;
    this_00->end_ = (int)lVar10 + uVar2;
  }
  if (!bVar5) {
    InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                      (GeneratedCodeInfo *)local_c0);
  }
  if (bVar4) {
    TextFormat::PrintToString((Message *)local_c0,(string *)data);
  }
  else {
    MessageLite::SerializeToString((MessageLite *)local_c0,(string *)data);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_c0);
LAB_0027cb4b:
  GeneratedCodeInfo::~GeneratedCodeInfo(&local_80);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    const std::string& insertion_content, size_t insertion_offset,
    size_t insertion_length, size_t indent_length) {
  auto it = directory_->files_.find(filename_ + ".pb.meta");
  if (it == directory_->files_.end() && info_to_insert_.annotation().empty()) {
    // No metadata was recorded for this file.
    return;
  }
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  std::string* encoded_data = nullptr;
  if (it != directory_->files_.end()) {
    encoded_data = &it->second;
    // Try to decode a GeneratedCodeInfo proto from the .pb.meta file. It may be
    // in wire or text format. Keep the same format when the data is written out
    // later.
    if (!metadata.ParseFromString(*encoded_data)) {
      if (!TextFormat::ParseFromString(*encoded_data, &metadata)) {
        // The metadata is invalid.
        std::cerr
            << filename_
            << ".pb.meta: Could not parse metadata as wire or text format."
            << std::endl;
        return;
      }
      // Generators that use the public plugin interface emit text-format
      // metadata (because in the public plugin protocol, file content must be
      // UTF8-encoded strings).
      is_text_format = true;
    }
  } else {
    // Create a new file to store the new metadata in info_to_insert_.
    encoded_data =
        &directory_->files_.insert({filename_ + ".pb.meta", ""}).first->second;
  }
  GeneratedCodeInfo new_metadata;
  bool crossed_offset = false;
  size_t to_add = 0;
  for (const auto& source_annotation : metadata.annotation()) {
    // The first time an annotation at or after the insertion point is found,
    // insert the new metadata from info_to_insert_. Shift all annotations
    // after the new metadata by the length of the text that was inserted
    // (including any additional indent length).
    if (source_annotation.begin() >= insertion_offset && !crossed_offset) {
      crossed_offset = true;
      InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                        new_metadata);
      to_add += insertion_length;
    }
    GeneratedCodeInfo::Annotation* annotation = new_metadata.add_annotation();
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + to_add);
    annotation->set_end(annotation->end() + to_add);
  }
  // If there were never any annotations at or after the insertion point,
  // make sure to still insert the new metadata from info_to_insert_.
  if (!crossed_offset) {
    InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                      new_metadata);
  }
  if (is_text_format) {
    TextFormat::PrintToString(new_metadata, encoded_data);
  } else {
    new_metadata.SerializeToString(encoded_data);
  }
}